

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar2;
  pointer pcVar3;
  key_type *__k;
  bool bVar4;
  LogMessage *other;
  iterator iVar5;
  Type *__k_00;
  mapped_type *pmVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  Rep *pRVar10;
  Result *_result;
  long lVar11;
  _Rb_tree_header *p_Var12;
  string err;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  undefined1 local_88 [56];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,2,-1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (this->ndArrayInterpretation == true) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Split","");
            this_00 = &this->blobNameToRank;
            validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_a8,this_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            local_88._0_8_ = local_88 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Split","");
            validateRankCount(__return_storage_ptr__,layer,(string *)local_88,3,-1,this_00);
            if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
              operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              other = google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ")
              ;
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,other);
              google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
            }
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::find(&this_00->_M_t,
                           (key_type *)
                           ((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
            p_Var12 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar5._M_node != p_Var12) {
              __k_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                 (&(layer->output_).super_RepeatedPtrFieldBase,0);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at(this_00,__k_00);
              pRVar10 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar10 != (Rep *)0x0) {
                pRVar10 = (Rep *)pRVar10->elements;
              }
              lVar8 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
              if (lVar8 != 0) {
                iVar2 = *pmVar6;
                lVar11 = 0;
                do {
                  __k = *(key_type **)((long)pRVar10->elements + lVar11 + -8);
                  iVar5 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::find(&this_00->_M_t,__k);
                  if (((_Rb_tree_header *)iVar5._M_node != p_Var12) &&
                     (pmVar6 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               ::at(this_00,__k), iVar2 != *pmVar6)) {
                    local_108._M_string_length = 0;
                    local_108.field_2._M_local_buf[0] = '\0';
                    plVar7 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                    lVar8 = *plVar7;
                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_e8,lVar8,plVar7[1] + lVar8);
                    std::operator+(&local_c8,"Layer \'",&local_e8);
                    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
                    plVar9 = plVar7 + 2;
                    if ((long *)*plVar7 == plVar9) {
                      local_40 = *plVar9;
                      lStack_38 = plVar7[3];
                      local_50 = &local_40;
                    }
                    else {
                      local_40 = *plVar9;
                      local_50 = (long *)*plVar7;
                    }
                    local_48 = plVar7[1];
                    *plVar7 = (long)plVar9;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
                    if (local_50 != &local_40) {
                      operator_delete(local_50,local_40 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p == &local_108.field_2) {
                      return __return_storage_ptr__;
                    }
                    operator_delete(local_108._M_dataplus._M_p,
                                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                             local_108.field_2._M_local_buf[0]) + 1);
                    return __return_storage_ptr__;
                  }
                  lVar11 = lVar11 + 8;
                } while (lVar8 << 3 != lVar11);
              }
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));

    // between 2 and any number of outputs
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Split", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Split", 3, -1, blobNameToRank));

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return Result();
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}